

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9SpecI(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  char *pcVar5;
  uint fStart;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  fVerbose = 0;
  Extra_UtilGetoptReset();
  fStart = 1;
  local_40 = 25000;
  local_44 = 100;
  local_3c = 1;
LAB_00279cf5:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FCfmvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 < 0x46) {
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          Gia_CommandSpecI(pAbc->pGia,local_44,local_40,fStart,local_3c,fVerbose);
          return 0;
        }
        pcVar3 = "Abc_CommandAbc9SpecI(): There is no AIG.\n";
        iVar4 = -1;
        goto LAB_00279ed9;
      }
      if (iVar1 != 0x43) goto LAB_00279e08;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_00279dfc:
        Abc_Print(-1,pcVar3);
        goto LAB_00279e08;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_40 = uVar2;
    }
    else {
      if (iVar1 == 0x6d) {
        local_3c = local_3c ^ 1;
        goto LAB_00279cf5;
      }
      if (iVar1 == 0x66) {
        fStart = fStart ^ 1;
        goto LAB_00279cf5;
      }
      if (iVar1 != 0x46) goto LAB_00279e08;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_00279dfc;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_44 = uVar2;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar2 < 0) {
LAB_00279e08:
      Abc_Print(-2,"usage: &speci [-FC num] [-fmvh]\n");
      Abc_Print(-2,"\t         refines equivalence classes using speculative reduction\n");
      Abc_Print(-2,"\t-F num : the max number of time frames [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)local_40);
      pcVar5 = "yes";
      pcVar3 = "yes";
      if (fStart == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle starting BMC from a later frame [default = %s]\n",pcVar3);
      pcVar3 = "miter";
      if (local_3c == 0) {
        pcVar3 = "circuit";
      }
      Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar3);
      if (fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar3 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_00279ed9:
      Abc_Print(iVar4,pcVar3);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SpecI( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_CommandSpecI( Gia_Man_t * pGia, int nFrames, int nBTLimit, int fUseStart, int fCheckMiter, int fVerbose );
    int nFrames     =   100;
    int nBTLimit    = 25000;
    int fUseStart   =     1;
    int fCheckMiter =     1;
    int fVerbose    =     0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCfmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'f':
            fUseStart ^= 1;
            break;
        case 'm':
            fCheckMiter ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SpecI(): There is no AIG.\n" );
        return 1;
    }
    Gia_CommandSpecI( pAbc->pGia, nFrames, nBTLimit, fUseStart, fCheckMiter, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &speci [-FC num] [-fmvh]\n" );
    Abc_Print( -2, "\t         refines equivalence classes using speculative reduction\n" );
    Abc_Print( -2, "\t-F num : the max number of time frames [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-f     : toggle starting BMC from a later frame [default = %s]\n", fUseStart? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}